

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidBranchOutputNotProduced2(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  TypeUnion TVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  ActivationParams *pAVar13;
  ActivationReLU *pAVar14;
  NeuralNetworkLayer *pNVar15;
  BranchLayerParams *pBVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  void *pvVar18;
  NeuralNetwork *pNVar19;
  ostream *poVar20;
  long lVar21;
  undefined8 *puVar22;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar23;
  Arena *pAVar24;
  Model m;
  Result res;
  NeuralNetwork nnIf;
  Model local_d0;
  Result local_a0;
  NeuralNetwork local_78;
  
  CoreML::Specification::Model::Model(&local_d0,(Arena *)0x0,false);
  if (local_d0.description_ == (ModelDescription *)0x0) {
    pAVar24 = (Arena *)(local_d0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_d0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    local_d0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar24);
  }
  pRVar4 = ((local_d0.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aa83b:
    pRVar23 = &(local_d0.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar23->super_RepeatedPtrFieldBase).arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar23->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((local_d0.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aa83b;
    ((local_d0.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar18 = pRVar4->elements[iVar1];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar18 + 0x10),"A",puVar22);
  if (*(long *)((long)pvVar18 + 0x20) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar24);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar24);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (*(long *)((long)pvVar18 + 0x20) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar24);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar24);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  this = &pAVar10->shape_;
  uVar2 = (pAVar10->shape_).current_size_;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar2] = 1;
  this->current_size_ = uVar2 + 1;
  if (local_d0.description_ == (ModelDescription *)0x0) {
    pAVar24 = (Arena *)(local_d0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_d0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    local_d0.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar24);
  }
  pRVar4 = ((local_d0.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aa9a7:
    pRVar23 = &(local_d0.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar23->super_RepeatedPtrFieldBase).arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar23->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar1 = ((local_d0.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aa9a7;
    ((local_d0.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar18 = pRVar4->elements[iVar1];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar18 + 0x10),"B",puVar22);
  if (*(long *)((long)pvVar18 + 0x20) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar24);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar24);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&local_78,(Arena *)0x0,false);
  if (local_78.layers_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
LAB_001aaa6e:
    pNVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_78.layers_.super_RepeatedPtrFieldBase.arena_);
    pNVar15 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&local_78.layers_.super_RepeatedPtrFieldBase,pNVar15);
  }
  else {
    lVar21 = (long)local_78.layers_.super_RepeatedPtrFieldBase.current_size_;
    if ((local_78.layers_.super_RepeatedPtrFieldBase.rep_)->allocated_size <=
        local_78.layers_.super_RepeatedPtrFieldBase.current_size_) goto LAB_001aaa6e;
    local_78.layers_.super_RepeatedPtrFieldBase.current_size_ =
         local_78.layers_.super_RepeatedPtrFieldBase.current_size_ + 1;
    pNVar15 = (NeuralNetworkLayer *)
              (local_78.layers_.super_RepeatedPtrFieldBase.rep_)->elements[lVar21];
  }
  if (pNVar15->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar15);
    pNVar15->_oneof_case_[0] = 0x82;
    uVar5 = (pNVar15->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                        (pAVar24);
    (pNVar15->layer_).activation_ = pAVar13;
  }
  pAVar13 = (pNVar15->layer_).activation_;
  if (pAVar13->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar13);
    pAVar13->_oneof_case_[0] = 10;
    uVar5 = (pAVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar24);
    (pAVar13->NonlinearityType_).relu_ = pAVar14;
  }
  uVar5 = (pNVar15->super_MessageLite)._internal_metadata_.ptr_;
  puVar22 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar15->name_,"if_relu",puVar22);
  pRVar4 = (pNVar15->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aab40:
    pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar15->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar15->input_).super_RepeatedPtrFieldBase,pbVar17);
  }
  else {
    iVar1 = (pNVar15->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aab40;
    (pNVar15->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar18 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x3b8534);
  pRVar4 = (pNVar15->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aab90:
    pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar15->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar15->output_).super_RepeatedPtrFieldBase,pbVar17);
  }
  else {
    iVar1 = (pNVar15->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aab90;
    (pNVar15->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar18 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x3d8b56);
  if (local_d0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_d0);
    local_d0._oneof_case_[0] = 500;
    pAVar24 = (Arena *)(local_d0.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_d0.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    local_d0.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar24);
  }
  TVar7 = local_d0.Type_;
  (local_d0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_d0.Type_.pipeline_)->models_;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_d0.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aac31:
    pNVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar15 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar15);
  }
  else {
    iVar1 = (local_d0.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aac31;
    (local_d0.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar15 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  if (pNVar15->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar15);
    pNVar15->_oneof_case_[0] = 0x82;
    uVar5 = (pNVar15->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationParams>
                        (pAVar24);
    (pNVar15->layer_).activation_ = pAVar13;
  }
  pAVar13 = (pNVar15->layer_).activation_;
  if (pAVar13->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar13);
    pAVar13->_oneof_case_[0] = 10;
    uVar5 = (pAVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ActivationReLU>
                        (pAVar24);
    (pAVar13->NonlinearityType_).relu_ = pAVar14;
  }
  uVar5 = (pNVar15->super_MessageLite)._internal_metadata_.ptr_;
  puVar22 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar15->name_,"condition_producing_layer",puVar22);
  pRVar4 = (pNVar15->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aad02:
    pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar15->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar15->input_).super_RepeatedPtrFieldBase,pbVar17);
  }
  else {
    iVar1 = (pNVar15->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aad02;
    (pNVar15->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar18 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x3b8534);
  pRVar4 = (pNVar15->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aad53:
    pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar15->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar15->output_).super_RepeatedPtrFieldBase,pbVar17);
  }
  else {
    iVar1 = (pNVar15->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aad53;
    (pNVar15->output_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pvVar18 = pRVar4->elements[iVar1];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x3b8bcb);
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(TVar7.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001aada7:
    pNVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar15 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar15);
  }
  else {
    iVar1 = (TVar7.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar1) goto LAB_001aada7;
    (TVar7.treeensembleregressor_)->postevaluationtransform_ = iVar1 + 1;
    pNVar15 = (NeuralNetworkLayer *)pRVar4->elements[iVar1];
  }
  if (pNVar15->_oneof_case_[0] != 0x25d) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar15);
    pNVar15->_oneof_case_[0] = 0x25d;
    uVar5 = (pNVar15->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pBVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BranchLayerParams>
                        (pAVar24);
    (pNVar15->layer_).branch_ = pBVar16;
  }
  uVar5 = (pNVar15->super_MessageLite)._internal_metadata_.ptr_;
  puVar22 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  pCVar6 = (pNVar15->layer_).convolution_;
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pNVar15->name_,"branch_layer",puVar22);
  pRVar4 = (pNVar15->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pNVar15->input_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pNVar15->input_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar18 = pRVar4->elements[iVar1];
      goto LAB_001aae5c;
    }
  }
  pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar15->input_).super_RepeatedPtrFieldBase.arena_);
  pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar15->input_).super_RepeatedPtrFieldBase,pbVar17);
LAB_001aae5c:
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x3b8bcb);
  lVar21._0_4_ = (pCVar6->kernelsize_).current_size_;
  lVar21._4_4_ = (pCVar6->kernelsize_).total_size_;
  if (lVar21 == 0) {
    uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pNVar19 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                        (pAVar24);
    *(NeuralNetwork **)&pCVar6->kernelsize_ = pNVar19;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom(*(NeuralNetwork **)&pCVar6->kernelsize_,&local_78);
  CoreML::validate<(MLModelType)500>(&local_a0,&local_d0);
  bVar8 = CoreML::Result::good(&local_a0);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x113f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_message._M_dataplus._M_p != &local_a0.m_message.field_2) {
    operator_delete(local_a0.m_message._M_dataplus._M_p,
                    local_a0.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&local_78);
  CoreML::Specification::Model::~Model(&local_d0);
  return (uint)bVar8;
}

Assistant:

int testInvalidBranchOutputNotProduced2() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");

    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");

    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}